

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this)

{
  ostream *poVar1;
  reference pvVar2;
  string local_30 [32];
  XmlWriter *local_10;
  XmlWriter *this_local;
  
  local_10 = this;
  newlineIfNecessary(this);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_30,(ulong)&this->m_indent);
  std::__cxx11::string::operator=((string *)&this->m_indent,local_30);
  std::__cxx11::string::~string(local_30);
  if ((this->m_tagIsOpen & 1U) == 0) {
    poVar1 = stream(this);
    poVar1 = std::operator<<(poVar1,(string *)&this->m_indent);
    poVar1 = std::operator<<(poVar1,"</");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->m_tags);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,">\n");
  }
  else {
    poVar1 = stream(this);
    std::operator<<(poVar1,"/>\n");
    this->m_tagIsOpen = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->m_tags);
  return this;
}

Assistant:

XmlWriter& endElement() {
            newlineIfNecessary();
            m_indent = m_indent.substr( 0, m_indent.size()-2 );
            if( m_tagIsOpen ) {
                stream() << "/>\n";
                m_tagIsOpen = false;
            }
            else {
                stream() << m_indent << "</" << m_tags.back() << ">\n";
            }
            m_tags.pop_back();
            return *this;
        }